

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Common.hxx
# Opt level: O2

XMLNodeAdapter * FileParse::operator<<(XMLNodeAdapter *node,Child<const_BSDFData::Length> *child)

{
  pointer pbVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *nodeName;
  pointer pbVar2;
  string_view name;
  XMLNodeAdapter childNode;
  XMLNodeAdapter local_60;
  XMLNodeAdapter local_48;
  
  XMLNodeAdapter::XMLNodeAdapter(&local_60,node);
  pbVar1 = (child->nodeNames).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar2 = (child->nodeNames).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pbVar2 != pbVar1; pbVar2 = pbVar2 + 1) {
    name._M_str = (pbVar2->_M_dataplus)._M_p;
    name._M_len = pbVar2->_M_string_length;
    XMLNodeAdapter::addChild(&local_48,&local_60,name);
    std::__shared_ptr<XMLNodeAdapter::Impl,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&local_60.pimpl_.super___shared_ptr<XMLNodeAdapter::Impl,_(__gnu_cxx::_Lock_policy)2>
               ,&local_48.pimpl_.
                 super___shared_ptr<XMLNodeAdapter::Impl,_(__gnu_cxx::_Lock_policy)2>);
    XMLNodeAdapter::~XMLNodeAdapter(&local_48);
  }
  BSDFData::operator<<(&local_60,child->data);
  XMLNodeAdapter::~XMLNodeAdapter(&local_60);
  return node;
}

Assistant:

inline NodeAdapter & operator<<(NodeAdapter & node, const Child<T> & child)
    {
        auto childNode = node;
        for(const auto & nodeName : child.nodeNames)
        {
            childNode = childNode.addChild(nodeName);
        }
        childNode << child.data;
        return node;
    }